

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statusor.cc
# Opt level: O0

void __thiscall
absl::lts_20250127::BadStatusOrAccess::InitWhat::anon_class_8_1_8991fb9c::operator()
          (anon_class_8_1_8991fb9c *this)

{
  BadStatusOrAccess *pBVar1;
  AlphaNum *in_RCX;
  string local_b0;
  AlphaNum local_90;
  AlphaNum local_60;
  string local_30;
  anon_class_8_1_8991fb9c *local_10;
  anon_class_8_1_8991fb9c *this_local;
  
  pBVar1 = this->this;
  local_10 = this;
  AlphaNum::AlphaNum(&local_60,"Bad StatusOr access: ");
  Status::ToString_abi_cxx11_(&local_b0,&pBVar1->status_,kDefault);
  AlphaNum::AlphaNum<std::allocator<char>>(&local_90,&local_b0);
  StrCat_abi_cxx11_(&local_30,(lts_20250127 *)&local_60,&local_90,in_RCX);
  std::__cxx11::string::operator=((string *)&pBVar1->what_,(string *)&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)&local_b0);
  return;
}

Assistant:

void BadStatusOrAccess::InitWhat() const {
  absl::call_once(init_what_, [this] {
    what_ = absl::StrCat("Bad StatusOr access: ", status_.ToString());
  });
}